

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O1

int struct_size_field_list(FMFieldList list,int pointer_size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long elements;
  int local_3c;
  int local_38 [2];
  
  if (list->field_name == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    lVar6 = 0;
    iVar2 = 0;
    do {
      iVar5 = 0;
      iVar7 = 0;
      bVar1 = false;
      do {
        iVar3 = IOget_array_size_dimen(list[lVar6].field_type,list,iVar5,&local_3c);
        if (iVar3 == 0) {
          bVar4 = false;
          bVar1 = true;
        }
        else {
          if (local_3c != -1) {
            iVar7 = 1;
          }
          bVar4 = local_3c == -1 && iVar3 == -1;
        }
        if (bVar4) {
          iVar7 = -1;
          break;
        }
        iVar5 = iVar5 + 1;
      } while (!bVar1);
      iVar5 = 8;
      if (iVar7 != 1) {
        FMarray_str_to_data_type(list[lVar6].field_type,local_38);
        iVar5 = list[lVar6].field_size * local_38[0];
      }
      if (iVar5 < 1) {
        __assert_fail("field_size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_compat.c"
                      ,0x48,"int struct_size_field_list(FMFieldList, int)");
      }
      iVar5 = iVar5 + list[lVar6].field_offset;
      if (iVar2 <= iVar5) {
        iVar2 = iVar5;
      }
      lVar6 = lVar6 + 1;
    } while (list[lVar6].field_name != (char *)0x0);
  }
  return iVar2;
}

Assistant:

static
int
struct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if (is_var_array_field(list, i) == 1) {
	    /* variant array, real_field_size is ioformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}